

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::TextureLevelPyramid::TextureLevelPyramid(TextureLevelPyramid *this,TextureLevelPyramid *other)

{
  int iVar1;
  pointer pAVar2;
  TextureFormat format;
  undefined8 uVar3;
  int iVar4;
  pointer pPVar5;
  long lVar6;
  long lVar7;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *this_00;
  pointer pPVar8;
  long lVar9;
  allocator_type local_5a;
  allocator_type local_59;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_58;
  TextureLevelPyramid *local_50;
  TextureLevelPyramid *local_48;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *local_40;
  undefined8 local_38;
  
  this->m_format = other->m_format;
  this_00 = &this->m_data;
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::vector(this_00,(long)((int)((ulong)((long)(other->m_access).
                                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(other->m_access).
                                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         -0x33333333),&local_59);
  local_58 = &this->m_access;
  local_50 = this;
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            (local_58,(long)((int)((ulong)((long)(other->m_access).
                                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(other->m_access).
                                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                            -0x33333333),&local_5a);
  pPVar8 = (other->m_access).
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (other->m_access).
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pPVar5 - (long)pPVar8) >> 3) * -0x33333333) {
    lVar7 = 0;
    lVar9 = 0;
    lVar6 = 0;
    local_48 = other;
    local_40 = this_00;
    do {
      pAVar2 = (other->m_data).
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&pAVar2->m_cap + lVar9) != 0) {
        de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=
                  ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)
                   ((long)&((this_00->
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9),
                   (ArrayBuffer<unsigned_char,_1UL,_1UL> *)((long)&pAVar2->m_ptr + lVar9));
        iVar1 = *(int *)((long)(pPVar8->super_ConstPixelBufferAccess).m_size.m_data + lVar7);
        local_38 = *(undefined8 *)
                    ((long)&((this_00->
                             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9);
        format = *(TextureFormat *)
                  ((long)(pPVar8->super_ConstPixelBufferAccess).m_size.m_data + lVar7 + -8);
        iVar4 = getPixelSize(format);
        pPVar5 = (local_58->
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar3 = *(undefined8 *)
                 ((long)(pPVar8->super_ConstPixelBufferAccess).m_size.m_data + lVar7 + 4U);
        *(TextureFormat *)((long)(pPVar5->super_ConstPixelBufferAccess).m_size.m_data + lVar7 + -8)
             = format;
        *(int *)((long)(pPVar5->super_ConstPixelBufferAccess).m_size.m_data + lVar7) = iVar1;
        *(undefined8 *)((long)(pPVar5->super_ConstPixelBufferAccess).m_size.m_data + lVar7 + 4U) =
             uVar3;
        *(int *)((long)(pPVar5->super_ConstPixelBufferAccess).m_pitch.m_data + lVar7) = iVar4;
        iVar4 = iVar4 * iVar1;
        *(int *)((long)(pPVar5->super_ConstPixelBufferAccess).m_pitch.m_data + lVar7 + 4U) = iVar4;
        *(int *)((long)(pPVar5->super_ConstPixelBufferAccess).m_pitch.m_data + lVar7 + 8U) =
             (int)uVar3 * iVar4;
        *(undefined8 *)((long)(&(pPVar5->super_ConstPixelBufferAccess).m_pitch + 1) + lVar7) =
             local_38;
        pPVar8 = (local_48->m_access).
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar5 = (local_48->m_access).
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        this_00 = local_40;
        other = local_48;
      }
      lVar6 = lVar6 + 1;
      lVar9 = lVar9 + 0x10;
      lVar7 = lVar7 + 0x28;
    } while (lVar6 < (int)((ulong)((long)pPVar5 - (long)pPVar8) >> 3) * -0x33333333);
  }
  return;
}

Assistant:

TextureLevelPyramid::TextureLevelPyramid (const TextureLevelPyramid& other)
	: m_format	(other.m_format)
	, m_data	(other.getNumLevels())
	, m_access	(other.getNumLevels())
{
	for (int levelNdx = 0; levelNdx < other.getNumLevels(); levelNdx++)
	{
		if (!other.isLevelEmpty(levelNdx))
		{
			const tcu::ConstPixelBufferAccess& srcLevel = other.getLevel(levelNdx);

			m_data[levelNdx] = other.m_data[levelNdx];
			m_access[levelNdx] = PixelBufferAccess(srcLevel.getFormat(), srcLevel.getWidth(), srcLevel.getHeight(), srcLevel.getDepth(), m_data[levelNdx].getPtr());
		}
	}
}